

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec.cpp
# Opt level: O0

MPP_RET mpp_dec_reset(MppDec ctx)

{
  MPP_RET local_24;
  MPP_RET ret;
  MppDecImpl *dec;
  MppDec ctx_local;
  
  local_24 = MPP_OK;
  if (ctx == (MppDec)0x0) {
    _mpp_log_l(2,"mpp_dec","found NULL input dec %p\n","mpp_dec_reset",0);
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    if ((mpp_dec_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_dec","%p in\n","mpp_dec_reset",ctx);
    }
    if ((*(long *)((long)ctx + 8) != 0) && (*(long *)(*(long *)((long)ctx + 8) + 0x10) != 0)) {
      local_24 = (**(code **)(*(long *)((long)ctx + 8) + 0x10))(ctx);
    }
    if ((mpp_dec_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_dec","%p out ret %d\n","mpp_dec_reset",ctx,(ulong)(uint)local_24);
    }
    ctx_local._4_4_ = local_24;
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET mpp_dec_reset(MppDec ctx)
{
    MppDecImpl *dec = (MppDecImpl *)ctx;
    MPP_RET ret = MPP_OK;

    if (NULL == dec) {
        mpp_err_f("found NULL input dec %p\n", dec);
        return MPP_ERR_NULL_PTR;
    }

    dec_dbg_func("%p in\n", dec);

    if (dec->api && dec->api->reset)
        ret = dec->api->reset(dec);

    dec_dbg_func("%p out ret %d\n", dec, ret);

    return ret;
}